

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O1

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddSLessThan(InstructionBuilder *this,uint32_t op1,uint32_t op2)

{
  IRContext *pIVar1;
  uint32_t ty_id;
  uint32_t res_id;
  Instruction *pIVar2;
  pointer pOVar3;
  Operand *__cur;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  long lVar4;
  SmallVector<unsigned_int,_2UL> *this_01;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> inst;
  size_type __dnew;
  Bool bool_type;
  string message;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_130;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_128;
  undefined1 local_108 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_e8;
  Type local_e0;
  undefined1 local_b8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_98;
  size_t *local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  undefined1 local_58 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_38;
  
  local_e0.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0.kind_ = kBool;
  local_e0._vptr_Type = (_func_int **)&PTR__Type_00949a08;
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  ty_id = analysis::TypeManager::GetId
                    ((pIVar1->type_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                     _M_head_impl,&local_e0);
  pIVar2 = (Instruction *)operator_new(0x70);
  pIVar1 = this->context_;
  res_id = Module::TakeNextIdBound
                     ((pIVar1->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((res_id == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    local_108._0_8_ = (_func_int **)0x25;
    local_90 = &local_88.size_;
    local_90 = (size_t *)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)local_108);
    local_88.size_ = local_108._0_8_;
    *local_90 = 0x667265766f204449;
    local_90[1] = 0x797254202e776f6c;
    local_90[2] = 0x676e696e6e757220;
    local_90[3] = 0x746361706d6f6320;
    builtin_strncpy((char *)((long)local_90 + 0x1d),"act-ids.",8);
    local_88._vptr_SmallVector = (_func_int **)local_108._0_8_;
    *(char *)((long)local_90 + local_108._0_8_) = '\0';
    local_108._0_8_ = (_func_int **)0x0;
    local_108._8_8_ = 0;
    local_108._16_4_ = (array<signed_char,_4UL>)0x0;
    local_108._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_108,(char *)local_90);
    if (local_90 != &local_88.size_) {
      operator_delete(local_90,local_88.size_ + 1);
    }
  }
  local_108._24_8_ = local_108 + 0x10;
  local_108._0_8_ = &PTR__SmallVector_009488e0;
  local_e8._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_108._16_4_ = op1;
  local_108._8_8_ = 1;
  this_01 = &local_88;
  local_90 = (size_t *)CONCAT44(local_90._4_4_,1);
  local_88._vptr_SmallVector = (_func_int **)&PTR__SmallVector_009488e0;
  local_88.size_ = 0;
  local_88.small_data_ = (uint *)local_88.buffer;
  local_88.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (this_01,(SmallVector<unsigned_int,_2UL> *)local_108);
  local_b8._24_8_ = local_b8 + 0x10;
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._8_8_ = 1;
  local_60 = 1;
  local_58._0_8_ = &PTR__SmallVector_009488e0;
  local_58._8_8_ = 0;
  local_58._24_8_ = local_58 + 0x10;
  local_38._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_b8._16_4_ = op2;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_58,(SmallVector<unsigned_int,_2UL> *)local_b8);
  local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar4 = 0x60;
  pOVar3 = (pointer)operator_new(0x60);
  local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar3 + 2;
  local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = pOVar3;
  do {
    pOVar3->type = *(spv_operand_type_t *)
                    &this_01[-1].large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
    (pOVar3->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_009488e0;
    (pOVar3->words).size_ = 0;
    (pOVar3->words).small_data_ = (uint *)(pOVar3->words).buffer;
    (pOVar3->words).large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar3->words,this_01);
    pOVar3 = pOVar3 + 1;
    this_01 = (SmallVector<unsigned_int,_2UL> *)&this_01[1].size_;
    lVar4 = lVar4 + -0x30;
  } while (lVar4 != 0);
  local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = pOVar3;
  Instruction::Instruction(pIVar2,pIVar1,OpSLessThan,ty_id,res_id,&local_128);
  local_130._M_head_impl = pIVar2;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_128);
  lVar4 = -0x60;
  this_00 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_38;
  do {
    *(undefined ***)(this_00 + -0x20) = &PTR__SmallVector_009488e0;
    if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00 !=
        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                (this_00,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00);
    }
    *(undefined8 *)this_00 = 0;
    this_00 = this_00 + -0x30;
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0);
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,local_98._M_head_impl);
  }
  local_108._0_8_ = &PTR__SmallVector_009488e0;
  if (local_e8._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_e8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_e8._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  pIVar2 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_130);
  if (local_130._M_head_impl != (Instruction *)0x0) {
    (*((local_130._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  local_e0._vptr_Type = (_func_int **)&PTR__Type_00948bd0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_e0.decorations_);
  return pIVar2;
}

Assistant:

Instruction* AddSLessThan(uint32_t op1, uint32_t op2) {
    analysis::Bool bool_type;
    uint32_t type = GetContext()->get_type_mgr()->GetId(&bool_type);
    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> inst(new Instruction(
        GetContext(), spv::Op::OpSLessThan, type, GetContext()->TakeNextId(),
        {{SPV_OPERAND_TYPE_ID, {op1}}, {SPV_OPERAND_TYPE_ID, {op2}}}));
    return AddInstruction(std::move(inst));
  }